

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void collect_scan_var(gen_ctx_t gen_ctx,MIR_reg_t var)

{
  int iVar1;
  bitmap_t bm;
  VARR_int *pVVar2;
  VARR_MIR_reg_t *pVVar3;
  int *__ptr;
  MIR_reg_t *__ptr_00;
  lr_ctx *plVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  
  bm = gen_ctx->temp_bitmap;
  uVar7 = (ulong)var;
  bitmap_expand(bm,uVar7 + 1);
  if (bm != (bitmap_t)0x0) {
    uVar5 = bm->varr[var >> 6];
    bm->varr[var >> 6] = uVar5 | 1L << (uVar7 & 0x3f);
    if (((uVar5 >> (uVar7 & 0x3f) & 1) != 0) ||
       (plVar4 = gen_ctx->lr_ctx, 9999 < plVar4->scan_vars_num)) {
      return;
    }
    while (pVVar2 = plVar4->var_to_scan_var_map, pVVar2 != (VARR_int *)0x0) {
      uVar5 = pVVar2->els_num;
      if (uVar7 < uVar5) {
        pVVar3 = plVar4->scan_var_to_var_map;
        __ptr_00 = pVVar3->varr;
        if (__ptr_00 == (MIR_reg_t *)0x0) goto LAB_0016ac9c;
        sVar8 = pVVar3->els_num;
        uVar5 = sVar8 + 1;
        if (pVVar3->size < uVar5) {
          sVar8 = (uVar5 >> 1) + uVar5;
          __ptr_00 = (MIR_reg_t *)realloc(__ptr_00,sVar8 * 4);
          pVVar3->varr = __ptr_00;
          pVVar3->size = sVar8;
          sVar8 = pVVar3->els_num;
          plVar4 = gen_ctx->lr_ctx;
          uVar5 = sVar8 + 1;
        }
        pVVar3->els_num = uVar5;
        __ptr_00[sVar8] = var;
        iVar1 = plVar4->scan_vars_num;
        pVVar2 = plVar4->var_to_scan_var_map;
        plVar4->scan_vars_num = iVar1 + 1;
        if (((pVVar2 != (VARR_int *)0x0) && (pVVar2->varr != (int *)0x0)) &&
           (uVar7 < pVVar2->els_num)) {
          pVVar2->varr[uVar7] = iVar1;
          return;
        }
        goto LAB_0016ac97;
      }
      __ptr = pVVar2->varr;
      if (__ptr == (int *)0x0) goto LAB_0016ac8d;
      uVar6 = uVar5 + 1;
      if (pVVar2->size < uVar6) {
        sVar8 = (uVar6 >> 1) + uVar6;
        __ptr = (int *)realloc(__ptr,sVar8 * 4);
        pVVar2->varr = __ptr;
        pVVar2->size = sVar8;
        uVar5 = pVVar2->els_num;
        plVar4 = gen_ctx->lr_ctx;
        uVar6 = uVar5 + 1;
      }
      pVVar2->els_num = uVar6;
      __ptr[uVar5] = -1;
    }
    collect_scan_var_cold_4();
LAB_0016ac8d:
    collect_scan_var_cold_1();
  }
  collect_scan_var_cold_5();
LAB_0016ac97:
  collect_scan_var_cold_2();
LAB_0016ac9c:
  collect_scan_var_cold_3();
  return;
}

Assistant:

static void collect_scan_var (gen_ctx_t gen_ctx, MIR_reg_t var) {
  if (!bitmap_set_bit_p (temp_bitmap, var)) return;
  if (scan_vars_num >= MIR_MAX_COALESCE_VARS) return;
  while (VARR_LENGTH (int, var_to_scan_var_map) <= var) VARR_PUSH (int, var_to_scan_var_map, -1);
  VARR_PUSH (MIR_reg_t, scan_var_to_var_map, var);
  VARR_SET (int, var_to_scan_var_map, var, scan_vars_num++);
}